

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O3

void __thiscall
crnlib::dxt_hc::determine_alpha_endpoint_codebook_task(dxt_hc *this,uint64 data,void *param_2)

{
  uint *puVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  uint uVar4;
  uint uVar5;
  alpha_cluster *paVar6;
  uint uVar7;
  uint uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  alpha_cluster *paVar11;
  bool bVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint i;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  uint p;
  byte bVar20;
  uint8 t;
  long lVar21;
  dxt_hc *pdVar22;
  ulong uVar23;
  float fVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar33;
  uint uVar34;
  undefined1 auVar32 [16];
  uint uVar35;
  vector<unsigned_char> selectors;
  results results;
  results refinerResults;
  uint block_values [8];
  dxt_endpoint_refiner refiner;
  uint encoding_weight [8];
  uint alpha_values [8];
  dxt5_endpoint_optimizer optimizer;
  elemental_vector local_618;
  dxt_hc *local_608;
  alpha_cluster *local_600;
  results local_5f8;
  long local_5e0;
  uint *local_5d8;
  ulong local_5d0;
  vector<unsigned_long_long> *local_5c8;
  color_quad_u8 (*local_5c0) [16];
  ulong local_5b8;
  ulong local_5b0;
  uchar *local_5a8;
  unsigned_long_long *local_5a0;
  uint *local_598;
  uchar *local_590;
  ulong local_588;
  ulong local_580;
  ulong local_578;
  results local_570;
  params local_560;
  params local_540;
  uint local_508 [8];
  dxt_endpoint_refiner local_4e8;
  uint local_4d8 [4];
  uint local_4c8;
  uint uStack_4c4;
  uint uStack_4c0;
  uint uStack_4bc;
  uint uStack_4b8;
  uint local_4b4 [9];
  dxt5_endpoint_optimizer local_490;
  
  uVar4 = this->m_pTask_pool->m_num_threads;
  dxt5_endpoint_optimizer::dxt5_endpoint_optimizer(&local_490);
  dxt_endpoint_refiner::dxt_endpoint_refiner(&local_4e8);
  local_618.m_p = (void *)0x0;
  local_618.m_size = 0;
  local_618.m_capacity = 0;
  uVar15 = (this->m_alpha_clusters).m_size;
  if ((uint)data < uVar15) {
    local_5c8 = this->m_block_selectors;
    local_608 = this;
    do {
      uVar14 = data & 0xffffffff;
      paVar6 = (this->m_alpha_clusters).m_p;
      uVar25 = paVar6[uVar14].pixels.m_size;
      uVar17 = (uint)data;
      pdVar22 = this;
      if (uVar25 != 0) {
        local_560.m_block_index = 0;
        local_560.m_pPixels = paVar6[uVar14].pixels.m_p;
        local_560.m_comp_index = 0;
        local_560.m_quality = cCRNDXTQualityUber;
        local_560.m_use_both_block_types = false;
        local_600 = paVar6;
        local_560.m_num_pixels = uVar25;
        if (local_618.m_size != uVar25) {
          if (local_618.m_size <= uVar25) {
            if (local_618.m_capacity < uVar25) {
              elemental_vector::increase_capacity
                        (&local_618,uVar25,local_618.m_size + 1 == uVar25,1,(object_mover)0x0,false)
              ;
            }
            memset((void *)((ulong)local_618.m_size + (long)local_618.m_p),0,
                   (ulong)(uVar25 - local_618.m_size));
          }
          local_618.m_size = uVar25;
        }
        local_5f8.m_pSelectors = (uint8 *)local_618.m_p;
        dxt5_endpoint_optimizer::compute(&local_490,&local_560,&local_5f8);
        paVar6[uVar14].first_endpoint = (uint)local_5f8.m_first_endpoint;
        paVar6[uVar14].second_endpoint = (uint)local_5f8.m_second_endpoint;
        dxt5_block::get_block_values
                  (local_508,(uint)local_5f8.m_first_endpoint,(uint)local_5f8.m_second_endpoint);
        pdVar22 = local_608;
        local_5d8 = paVar6[uVar14].alpha_values;
        lVar13 = 0;
        do {
          uVar5 = local_508[(byte)(&g_dxt5_from_linear)[lVar13]];
          local_600[uVar14].alpha_values[lVar13] = uVar5;
          (&uStack_4b8)[lVar13] = uVar5;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 8);
        iVar19 = paVar6[uVar14].first_endpoint - paVar6[uVar14].second_endpoint;
        uVar15 = (uint)(iVar19 * iVar19) >> 3;
        if (0x7ff < uVar15) {
          uVar15 = 0x800;
        }
        if ((uint)(iVar19 * iVar19) < 8) {
          uVar15 = 1;
        }
        fVar24 = (float)uVar15;
        uVar15 = (uint)(fVar24 * 1.15);
        uVar25 = (uint)(fVar24 * 1.1285714);
        uVar26 = (uint)(fVar24 * 1.1071428);
        uVar27 = (uint)(fVar24 * 1.0857142);
        local_4d8[0] = (int)(fVar24 * 1.15 - 2.1474836e+09) & (int)uVar15 >> 0x1f | uVar15;
        local_4d8[1] = (int)(fVar24 * 1.1285714 - 2.1474836e+09) & (int)uVar25 >> 0x1f | uVar25;
        local_4d8[2] = (int)(fVar24 * 1.1071428 - 2.1474836e+09) & (int)uVar26 >> 0x1f | uVar26;
        local_4d8[3] = (int)(fVar24 * 1.0857142 - 2.1474836e+09) & (int)uVar27 >> 0x1f | uVar27;
        uVar15 = (uint)(fVar24 * 1.0642858);
        uVar25 = (uint)(fVar24 * 1.0428572);
        uVar26 = (uint)(fVar24 * 1.0214286);
        uVar27 = (uint)(fVar24 * 1.0);
        local_4c8 = (int)(fVar24 * 1.0642858 - 2.1474836e+09) & (int)uVar15 >> 0x1f | uVar15;
        uStack_4c4 = (int)(fVar24 * 1.0428572 - 2.1474836e+09) & (int)uVar25 >> 0x1f | uVar25;
        uStack_4c0 = (int)(fVar24 * 1.0214286 - 2.1474836e+09) & (int)uVar26 >> 0x1f | uVar26;
        uStack_4bc = (int)(fVar24 * 1.0 - 2.1474836e+09) & (int)uVar27 >> 0x1f | uVar27;
        bVar12 = this->m_has_etc_color_blocks;
        if (bVar12 != false) {
          uVar15 = 1;
          if ((6 < iVar19) && (uVar15 = (iVar19 + 0xcU) / 0x12, 0xe < uVar15)) {
            uVar15 = 0xf;
          }
          uVar25 = (uint)local_5f8.m_first_endpoint + (uint)local_5f8.m_second_endpoint + 1 >> 1 &
                   0xff;
          lVar13 = 0;
          do {
            auVar2 = *(undefined1 (*) [16])
                      (determine_alpha_endpoint_codebook_task::stripped_modifier_table[iVar19 < 7] +
                      lVar13);
            iVar28 = auVar2._4_4_;
            auVar32._4_4_ = iVar28;
            auVar32._0_4_ = iVar28;
            auVar32._8_4_ = auVar2._12_4_;
            auVar32._12_4_ = auVar2._12_4_;
            uVar26 = auVar2._0_4_ * uVar15 + uVar25;
            uVar27 = iVar28 * uVar15 + uVar25;
            uVar29 = (int)((auVar2._8_8_ & 0xffffffff) * (ulong)uVar15) + uVar25;
            uVar30 = (int)((auVar32._8_8_ & 0xffffffff) * (ulong)uVar15) + uVar25;
            uVar31 = -(uint)((int)uVar26 < 0xff);
            uVar33 = -(uint)((int)uVar27 < 0xff);
            uVar34 = -(uint)((int)uVar29 < 0xff);
            uVar35 = -(uint)((int)uVar30 < 0xff);
            uVar26 = ~uVar31 & 0xff | uVar26 & uVar31;
            uVar27 = ~uVar33 & 0xff | uVar27 & uVar33;
            uVar29 = ~uVar34 & 0xff | uVar29 & uVar34;
            uVar30 = ~uVar35 & 0xff | uVar30 & uVar35;
            uVar26 = -(uint)(0 < (int)uVar26) & uVar26;
            uVar27 = -(uint)(0 < (int)uVar27) & uVar27;
            uVar29 = -(uint)(0 < (int)uVar29) & uVar29;
            uVar30 = -(uint)(0 < (int)uVar30) & uVar30;
            puVar1 = local_600[uVar14].alpha_values + lVar13;
            *puVar1 = uVar26;
            puVar1[1] = uVar27;
            puVar1[2] = uVar29;
            puVar1[3] = uVar30;
            (&uStack_4b8)[lVar13] = uVar26;
            local_4b4[lVar13] = uVar27;
            local_4b4[lVar13 + 1] = uVar29;
            local_4b4[lVar13 + 2] = uVar30;
            lVar13 = lVar13 + 4;
          } while (lVar13 != 8);
          paVar6[uVar14].first_endpoint = uVar25;
          paVar6[uVar14].second_endpoint = uVar15 << 4 | (uint)(iVar19 < 7) * 2 + 0xb;
        }
        local_5b8 = (ulong)this->m_num_alpha_blocks;
        if (local_5b8 != 0) {
          local_5c0 = local_608->m_blocks;
          local_5a8 = (local_608->m_block_encodings).m_p;
          bVar3 = local_608->m_has_subblocks;
          uVar18 = 0;
          do {
            local_5b0 = uVar18 + 1;
            local_588 = (ulong)paVar6[uVar14].blocks[uVar18 + 1].m_size;
            if (local_588 != 0) {
              local_590 = (*local_5c0)[0].field_0.c +
                          (local_608->m_params).m_alpha_component_indices[uVar18];
              local_598 = paVar6[uVar14].blocks[uVar18 + 1].m_p;
              local_5a0 = local_5c8[local_5b0].m_p;
              uVar18 = 0;
              do {
                local_578 = (ulong)local_598[uVar18];
                local_580 = (ulong)local_4d8[local_5a8[local_578]];
                lVar13 = 0;
                uVar16 = 0;
                do {
                  uVar15 = 0xffffffff;
                  lVar21 = 0;
                  uVar23 = 0;
                  do {
                    if (bVar12 == false) {
                      bVar20 = 7 - *(byte *)((long)&g_dxt5_to_linear + lVar21);
                      if ((local_5f8.m_reordered & 1U) == 0) {
                        bVar20 = *(byte *)((long)&g_dxt5_to_linear + lVar21);
                      }
                    }
                    else {
                      bVar20 = (byte)lVar21;
                    }
                    uVar26 = (uint)local_590[lVar13 * 4 +
                                             (ulong)(local_598[uVar18] >> (bVar3 & 0x1fU)) * 0x40] -
                             (&uStack_4b8)[bVar20];
                    uVar25 = -uVar26;
                    if (0 < (int)uVar26) {
                      uVar25 = uVar26;
                    }
                    if (uVar25 < uVar15) {
                      uVar23 = (ulong)bVar20;
                      uVar15 = uVar25;
                    }
                    lVar21 = lVar21 + 1;
                  } while (lVar21 != 8);
                  uVar16 = uVar23 | uVar16 << 3;
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 0x10);
                local_5a0[local_578] = uVar16 << 0x10 | local_580;
                uVar18 = uVar18 + 1;
              } while (uVar18 != local_588);
            }
            uVar18 = local_5b0;
          } while (local_5b0 != local_5b8);
        }
        local_540.m_alpha_comp_index = 0;
        local_540.m_highest_quality = true;
        local_540.m_perceptual = (local_608->m_params).m_perceptual;
        local_540.m_pSelectors = (uint8 *)local_618.m_p;
        local_540.m_pPixels = paVar6[uVar14].pixels.m_p;
        local_540.m_num_pixels = paVar6[uVar14].pixels.m_size;
        local_540.m_dxt1_selectors = false;
        local_540.m_error_to_beat = local_5f8.m_error;
        local_5e0 = uVar14 * 0x90;
        local_5d0 = data;
        local_540.m_block_index = uVar17;
        if (bVar12 == false) {
          bVar12 = dxt_endpoint_refiner::refine(&local_4e8,&local_540,&local_570);
          lVar13 = local_5e0;
          paVar11 = local_600;
          paVar6[uVar14].refined_alpha = bVar12;
          if (!bVar12) goto LAB_0017d30e;
          paVar6[uVar14].first_endpoint = (uint)local_570.m_low_color;
          paVar6[uVar14].second_endpoint = (uint)local_570.m_high_color;
          dxt5_block::get_block_values
                    (local_508,(uint)local_570.m_low_color,(uint)local_570.m_high_color);
          lVar21 = 0;
          do {
            *(uint *)((long)paVar11->refined_alpha_values + lVar21 * 4 + lVar13) =
                 local_508[(byte)(&g_dxt5_from_linear)[lVar21]];
            lVar21 = lVar21 + 1;
          } while (lVar21 != 8);
        }
        else {
          paVar6[uVar14].refined_alpha = false;
LAB_0017d30e:
          uVar9 = *(undefined8 *)local_5d8;
          uVar10 = *(undefined8 *)(local_5d8 + 2);
          uVar5 = local_5d8[5];
          uVar7 = local_5d8[6];
          uVar8 = local_5d8[7];
          paVar6[uVar14].refined_alpha_values[4] = local_5d8[4];
          paVar6[uVar14].refined_alpha_values[5] = uVar5;
          paVar6[uVar14].refined_alpha_values[6] = uVar7;
          paVar6[uVar14].refined_alpha_values[7] = uVar8;
          *(undefined8 *)paVar6[uVar14].refined_alpha_values = uVar9;
          *(undefined8 *)(paVar6[uVar14].refined_alpha_values + 2) = uVar10;
        }
        uVar15 = (pdVar22->m_alpha_clusters).m_size;
      }
      uVar25 = uVar17 + uVar4 + 1;
      data = (uint64)uVar25;
      this = pdVar22;
    } while (uVar25 < uVar15);
    if (local_618.m_p != (void *)0x0) {
      crnlib_free(local_618.m_p);
    }
  }
  dxt5_endpoint_optimizer::~dxt5_endpoint_optimizer(&local_490);
  return;
}

Assistant:

void dxt_hc::determine_alpha_endpoint_codebook_task(uint64 data, void*)
    {
        const uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        dxt5_endpoint_optimizer optimizer;
        dxt_endpoint_refiner refiner;
        crnlib::vector<uint8> selectors;

        for (uint cluster_index = (uint)data; cluster_index < m_alpha_clusters.size(); cluster_index += num_tasks)
        {
            alpha_cluster& cluster = m_alpha_clusters[cluster_index];
            if (cluster.pixels.empty())
            {
                continue;
            }

            dxt5_endpoint_optimizer::params params;
            params.m_pPixels = cluster.pixels.get_ptr();
            params.m_num_pixels = cluster.pixels.size();
            params.m_comp_index = 0;
            params.m_quality = cCRNDXTQualityUber;
            params.m_use_both_block_types = false;

            dxt5_endpoint_optimizer::results results;
            selectors.resize(params.m_num_pixels);
            results.m_pSelectors = selectors.get_ptr();

            optimizer.compute(params, results);
            cluster.first_endpoint = results.m_first_endpoint;
            cluster.second_endpoint = results.m_second_endpoint;
            uint block_values[8], alpha_values[8];
            dxt5_block::get_block_values(block_values, cluster.first_endpoint, cluster.second_endpoint);
            for (uint i = 0; i < 8; i++)
            {
                alpha_values[i] = cluster.alpha_values[i] = block_values[g_dxt5_from_linear[i]];
            }
            int delta = cluster.first_endpoint - cluster.second_endpoint;
            uint encoding_weight[8];
            for (uint endpoint_weight = math::clamp<uint>(delta * delta >> 3, 1, 2048), i = 0; i < 8; i++)
            {
                encoding_weight[i] = (uint)(endpoint_weight * math::lerp(1.15f, 1.0f, i / 7.0f));
            }

            if (m_has_etc_color_blocks)
            {
                static const int stripped_modifier_table[2][8] = {
                    { -10, -7, -5, -2, 1, 4, 6, 9 },
                    { -10, -3, -2, -1, 0, 1, 2, 9 }
                };
                int base_codeword = (results.m_first_endpoint + results.m_second_endpoint + 1) >> 1;
                int modifier_index = delta <= 6 ? 13 : 11;
                int multiplier = delta <= 6 ? 1 : math::clamp<int>((delta + 12) / 18, 1, 15);
                const int* modifier = stripped_modifier_table[modifier_index == 11 ? 0 : 1];
                for (int i = 0; i < 8; i++)
                {
                    alpha_values[i] = cluster.alpha_values[i] = math::clamp<int>(base_codeword + modifier[i] * multiplier, 0, 255);
                }
                cluster.first_endpoint = base_codeword;
                cluster.second_endpoint = multiplier << 4 | modifier_index;
            }

            for (uint a = 0; a < m_num_alpha_blocks; a++)
            {
                uint component_index = m_params.m_alpha_component_indices[a];
                crnlib::vector<uint>& blocks = cluster.blocks[cAlpha0 + a];
                for (uint i = 0; i < blocks.size(); i++)
                {
                    uint b = blocks[i];
                    uint weight = encoding_weight[m_block_encodings[b]];
                    uint64 selector = 0;
                    for (uint p = 0; p < 16; p++)
                    {
                        uint error_best = cUINT32_MAX;
                        uint8 s_best = 0;
                        for (uint8 t = 0; t < 8; t++)
                        {
                            uint8 s = m_has_etc_color_blocks ? t : results.m_reordered ? 7 - g_dxt5_to_linear[t]
                                                                                       : g_dxt5_to_linear[t];
                            int delta = m_blocks[m_has_subblocks ? b >> 1 : b][p][component_index] - alpha_values[s];
                            uint error = delta >= 0 ? delta : -delta;
                            if (error < error_best)
                            {
                                s_best = s;
                                error_best = error;
                            }
                        }
                        selector = selector << 3 | s_best;
                    }
                    m_block_selectors[cAlpha0 + a][b] = selector << 16 | weight;
                }
            }

            dxt_endpoint_refiner::params refinerParams;
            dxt_endpoint_refiner::results refinerResults;
            refinerParams.m_perceptual = m_params.m_perceptual;
            refinerParams.m_pSelectors = selectors.get_ptr();
            refinerParams.m_pPixels = cluster.pixels.get_ptr();
            refinerParams.m_num_pixels = cluster.pixels.size();
            refinerParams.m_dxt1_selectors = false;
            refinerParams.m_error_to_beat = results.m_error;
            refinerParams.m_block_index = cluster_index;
            cluster.refined_alpha = !m_has_etc_color_blocks && refiner.refine(refinerParams, refinerResults);
            if (cluster.refined_alpha)
            {
                cluster.first_endpoint = refinerResults.m_low_color;
                cluster.second_endpoint = refinerResults.m_high_color;
                dxt5_block::get_block_values(block_values, cluster.first_endpoint, cluster.second_endpoint);
                for (uint i = 0; i < 8; i++)
                {
                    cluster.refined_alpha_values[i] = block_values[g_dxt5_from_linear[i]];
                }
            }
            else
            {
                memcpy(cluster.refined_alpha_values, cluster.alpha_values, sizeof(cluster.refined_alpha_values));
            }
        }
    }